

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

bool __thiscall crnlib::ktx_texture::consistency_check(ktx_texture *this)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  vector<unsigned_char> *pvVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint32 uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint block_dim;
  uint bytes_per_block;
  uint local_7c;
  uint local_78 [18];
  
  bVar7 = check_header(this);
  if (!bVar7) {
    return false;
  }
  local_7c = 0;
  local_78[0] = 0;
  uVar1 = (this->m_header).m_glType;
  if ((uVar1 == 0) || (uVar2 = (this->m_header).m_glFormat, uVar2 == 0)) {
    if (uVar1 != 0 || (this->m_header).m_glFormat != 0) {
      return false;
    }
    bVar7 = get_ogl_fmt_desc((this->m_header).m_glInternalFormat,0,&local_7c,local_78);
    if (!bVar7) {
      return false;
    }
    if (local_7c == 1) {
      return false;
    }
  }
  else {
    bVar7 = get_ogl_fmt_desc(uVar2,uVar1,&local_7c,local_78);
    if (!bVar7) {
      return false;
    }
    if (1 < local_7c) {
      return false;
    }
  }
  uVar3 = this->m_block_dim;
  if ((uVar3 != local_7c) || (this->m_bytes_per_block != local_78[0])) {
    return false;
  }
  uVar1 = (this->m_header).m_numberOfMipmapLevels;
  iVar13 = uVar1 + (uVar1 == 0);
  uVar4 = (this->m_header).m_pixelDepth;
  uVar1 = (this->m_header).m_numberOfArrayElements;
  uVar24 = 1;
  if (1 < uVar4) {
    uVar24 = uVar4;
  }
  uVar2 = (this->m_header).m_numberOfFaces;
  iVar14 = uVar1 + (uVar1 == 0);
  if ((this->m_image_data).m_size != uVar24 * iVar14 * uVar2 * iVar13) {
    return false;
  }
  uVar1 = (this->m_header).m_pixelHeight;
  pvVar5 = (this->m_image_data).m_p;
  iVar10 = 0;
  iVar12 = 0;
  do {
    bVar11 = (byte)iVar12;
    uVar16 = (this->m_header).m_pixelWidth >> (bVar11 & 0x1f);
    uVar8 = uVar1 + (uVar1 == 0) >> (bVar11 & 0x1f);
    uVar19 = uVar24 >> (bVar11 & 0x1f);
    uVar16 = uVar16 + (uVar16 == 0) + (uVar3 - 1);
    iVar22 = 1;
    if ((uVar3 <= uVar16) && (uVar8 = uVar8 + (uVar8 == 0) + (uVar3 - 1), uVar3 <= uVar8)) {
      iVar20 = 0;
      uVar9 = (uVar16 / uVar3) * (uVar8 / uVar3) * this->m_bytes_per_block;
      uVar17 = (ulong)(uVar19 + (uVar19 == 0));
      iVar15 = iVar10;
      do {
        if (uVar2 != 0) {
          uVar21 = 0;
          iVar18 = iVar15;
          do {
            if (pvVar5[(uVar21 + (iVar20 + iVar12 * iVar14) * uVar2) * uVar24].m_size == uVar9) {
              uVar6 = 1;
              do {
                uVar23 = uVar6;
                if (uVar17 == uVar23) {
                  iVar22 = 0xb;
                  goto LAB_00190b07;
                }
                uVar6 = uVar23 + 1;
              } while (pvVar5[(uint)(iVar18 + (int)uVar23)].m_size == uVar9);
              iVar22 = 1;
LAB_00190b07:
              bVar7 = uVar23 < uVar17;
            }
            else {
              iVar22 = 1;
              bVar7 = true;
            }
            if (bVar7) goto LAB_00190b22;
            uVar21 = uVar21 + 1;
            iVar18 = iVar18 + uVar4 + (uVar4 == 0);
          } while (uVar21 != uVar2);
        }
        iVar22 = 8;
LAB_00190b22:
        if (iVar22 != 8) goto LAB_00190b3f;
        iVar20 = iVar20 + 1;
        iVar15 = iVar15 + uVar2 * uVar24;
      } while (iVar20 != iVar14);
      iVar22 = 5;
LAB_00190b3f:
      if (iVar22 == 5) {
        iVar22 = 0;
      }
    }
    if (iVar22 != 0) goto LAB_00190b88;
    iVar12 = iVar12 + 1;
    iVar10 = iVar10 + uVar2 * uVar24 * iVar14;
  } while (iVar12 != iVar13);
  iVar22 = 2;
LAB_00190b88:
  return iVar22 == 2;
}

Assistant:

bool ktx_texture::consistency_check() const
    {
        if (!check_header())
        {
            return false;
        }

        uint block_dim = 0, bytes_per_block = 0;
        if ((!m_header.m_glType) || (!m_header.m_glFormat))
        {
            if ((m_header.m_glType) || (m_header.m_glFormat))
            {
                return false;
            }
            if (!get_ogl_fmt_desc(m_header.m_glInternalFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim == 1)
            {
                return false;
            }
            //if ((get_width() % block_dim) || (get_height() % block_dim))
            //   return false;
        }
        else
        {
            if (!get_ogl_fmt_desc(m_header.m_glFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim > 1)
            {
                return false;
            }
        }
        if ((m_block_dim != block_dim) || (m_bytes_per_block != bytes_per_block))
        {
            return false;
        }

        if (m_image_data.size() != get_total_images())
        {
            return false;
        }

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            for (uint array_element = 0; array_element < get_array_size(); array_element++)
            {
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    for (uint zslice = 0; zslice < mip_depth; zslice++)
                    {
                        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));

                        uint expected_image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        if (image_data.size() != expected_image_size)
                        {
                            return false;
                        }
                    }
                }
            }
        }

        return true;
    }